

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

CodeLocationRange *
soul::SourceCodeUtilities::findRangeOfASTObject
          (CodeLocationRange *__return_storage_ptr__,ASTObject *object)

{
  CodeLocation *pCVar1;
  FindLexicalRangeVisitor v;
  FindLexicalRangeVisitor local_40;
  
  local_40.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR__FindLexicalRangeVisitor_0032d220;
  local_40.range.start.sourceCode.object = (SourceCodeText *)0x0;
  local_40.range.start.location.data = (char *)0x0;
  local_40.range.end.sourceCode.object = (SourceCodeText *)0x0;
  local_40.range.end.location.data = (char *)0x0;
  pCVar1 = CodeLocation::operator=(&local_40.range.end,&(object->context).location);
  CodeLocation::operator=(&local_40.range.start,pCVar1);
  findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::visitObject(soul::AST::
  ASTObject__(&local_40,object);
  CodeLocationRange::CodeLocationRange(__return_storage_ptr__,&local_40.range);
  findRangeOfASTObject::FindLexicalRangeVisitor::~FindLexicalRangeVisitor(&local_40);
  return __return_storage_ptr__;
}

Assistant:

CodeLocationRange SourceCodeUtilities::findRangeOfASTObject (AST::ASTObject& object)
{
    struct FindLexicalRangeVisitor  : public ASTVisitor
    {
        void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }

        CodeLocationRange range;
    };

    FindLexicalRangeVisitor v;
    v.range.start = v.range.end = object.context.location;
    v.visitObject (object);
    return v.range;
}